

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

bool __thiscall
clickhouse::ColumnFixedString::Load(ColumnFixedString *this,CodedInputStream *input,size_t rows)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  CodedInputStream *local_38;
  
  if (rows != 0) {
    local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->data_;
    bVar3 = false;
    uVar2 = 1;
    local_38 = input;
    do {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::resize((ulong)&local_60,(char)this->string_size_);
      bVar1 = CodedInputStream::ReadRaw
                        (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
      if (!bVar1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == &local_60.field_2) {
          return bVar3;
        }
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
        return bVar3;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_40,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      bVar3 = rows <= uVar2;
      bVar1 = uVar2 != rows;
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  return true;
}

Assistant:

bool ColumnFixedString::Load(CodedInputStream* input, size_t rows) {
    for (size_t i = 0; i < rows; ++i) {
        std::string s;
        s.resize(string_size_);

        if (!WireFormat::ReadBytes(input, &s[0], s.size())) {
            return false;
        }

        data_.push_back(std::move(s));
    }

    return true;
}